

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall dg::vr::StructureAnalyzer::collectAllocatedAreas(StructureAnalyzer *this)

{
  bool bVar1;
  ret_type this_00;
  Instruction *in_RDI;
  CallInst *call;
  AllocaInst *alloca;
  Instruction *inst;
  const_iterator __end4;
  const_iterator __begin4;
  BasicBlock *__range4;
  BasicBlock *block;
  const_iterator __end3;
  const_iterator __begin3;
  Function *__range3;
  Function *function;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  Module *in_stack_ffffffffffffff78;
  ret_type in_stack_ffffffffffffff88;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_60;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_58;
  reference local_50;
  reference local_48;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_38;
  reference local_30;
  reference local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_18;
  node_pointer local_10;
  
  local_10 = *(node_pointer *)in_RDI;
  local_18.NodePtr = (node_pointer)llvm::Module::begin(in_stack_ffffffffffffff78);
  local_20.NodePtr = (node_pointer)llvm::Module::end(in_stack_ffffffffffffff78);
  while (bVar1 = llvm::operator!=(&local_18,&local_20), bVar1) {
    local_30 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x1ef474);
    local_28 = local_30;
    local_38.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_ffffffffffffff78);
    local_40.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_ffffffffffffff78);
    while (bVar1 = llvm::operator!=(&local_38,&local_40), bVar1) {
      local_50 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)0x1ef4c3);
      local_48 = local_50;
      local_58.NodePtr =
           (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_ffffffffffffff78);
      local_60.NodePtr =
           (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff78);
      while (bVar1 = llvm::operator!=(&local_58,&local_60), bVar1) {
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
        ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                     *)0x1ef512);
        this_00 = llvm::dyn_cast<llvm::AllocaInst,llvm::Instruction_const>(in_RDI);
        if (this_00 == (ret_type)0x0) {
          in_stack_ffffffffffffff88 = llvm::dyn_cast<llvm::CallInst,llvm::Instruction_const>(in_RDI)
          ;
          if ((in_stack_ffffffffffffff88 != (ret_type)0x0) &&
             (bVar1 = isValidAllocationCall((Value *)__range4), bVar1)) {
            std::vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>>::
            emplace_back<llvm::CallInst_const*&>
                      ((vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_> *)
                       this_00,(CallInst **)in_stack_ffffffffffffff88);
          }
        }
        else {
          std::vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>>::
          emplace_back<llvm::AllocaInst_const*&>
                    ((vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_> *)
                     this_00,(AllocaInst **)in_stack_ffffffffffffff88);
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                      *)in_RDI);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)in_RDI);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_RDI);
  }
  return;
}

Assistant:

void StructureAnalyzer::collectAllocatedAreas() {
    // compute allocated areas throughout the code
    for (const llvm::Function &function : module) {
        for (const llvm::BasicBlock &block : function) {
            for (const llvm::Instruction &inst : block) {
                if (const auto *alloca =
                            llvm::dyn_cast<llvm::AllocaInst>(&inst)) {
                    allocatedAreas.emplace_back(alloca);
                }

                else if (const auto *call =
                                 llvm::dyn_cast<llvm::CallInst>(&inst)) {
                    if (isValidAllocationCall(call)) {
                        allocatedAreas.emplace_back(call);
                    }
                }
            }
        }
    }
}